

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O2

double inverf(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = 1.0;
  dVar2 = x;
  while (1.1920928955078125e-07 < ABS(dVar3)) {
    dVar1 = erf(dVar2);
    dVar3 = exp(-dVar2 * dVar2);
    dVar3 = ((dVar1 - x) * 0.8862269254527579) / dVar3;
    dVar2 = dVar2 - dVar3;
  }
  return dVar2;
}

Assistant:

double inverf(double x)
{   // compute the inverse error function via newton's method
    double t = x, dt = 1;
    while (fabs(dt) > FLT_EPSILON)
    {
        dt = 0.5 * sqrt(PI) * (erf(t) - x) / exp(-t*t);
        t -= dt;
    }
    return t;
}